

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

bool __thiscall QPDFJob::shouldRemoveUnreferencedResources(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  reference pQVar4;
  anon_class_1_0_00000001 local_329;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_328;
  reference local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *xobj;
  iterator __end3;
  iterator __begin3;
  Dictionary *__range3;
  QPDFObjectHandle *local_2d0;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2c8;
  QPDFObjGen local_2a4;
  byte local_29b;
  byte local_29a;
  allocator<char> local_299;
  string local_298 [32];
  undefined1 local_278 [8];
  QPDFObjectHandle xobject;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_258;
  QPDFObjGen local_234;
  allocator<char> local_229;
  string local_228 [32];
  undefined1 local_208 [8];
  QPDFObjectHandle resources;
  int local_1e8;
  int i;
  int n;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188 [32];
  undefined1 local_168 [8];
  QPDFObjectHandle kids;
  QPDFObjectHandle dict;
  undefined1 local_138 [8];
  QPDFObjGen og;
  undefined1 local_128 [8];
  QPDFObjectHandle node;
  string local_110 [32];
  string local_f0;
  undefined1 local_d0 [8];
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  anon_class_8_1_ba1d6c52 local_a8;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a0;
  undefined1 local_80 [8];
  set nodes_seen;
  set resources_seen;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (peVar3->remove_unreferenced_page_resources == re_no) {
    this_local._7_1_ = 0;
  }
  else {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (peVar3->remove_unreferenced_page_resources == re_yes) {
      this_local._7_1_ = 1;
    }
    else {
      QPDFObjGen::set::set
                ((set *)&nodes_seen.
                         super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                         _M_t._M_impl.super__Rb_tree_header._M_node_count);
      QPDFObjGen::set::set((set *)local_80);
      local_a8.pdf = pdf;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<QPDFJob::shouldRemoveUnreferencedResources(QPDF&)::__0,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_a0,&local_a8);
      doIfVerbose(this,&local_a0);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_a0);
      std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::list
                ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0);
      QPDF::getRoot((QPDF *)&local_f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_110,"/Pages",
                 (allocator<char> *)
                 ((long)&node.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_f0.field_2,&local_f0);
      std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0,
                 (value_type *)&local_f0.field_2);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_f0.field_2);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&node.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_f0);
      do {
        bVar1 = std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                          ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::function<void(Pipeline&,std::__cxx11::string_const&)>::
          function<QPDFJob::shouldRemoveUnreferencedResources(QPDF&)::__4,void>
                    ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_328,&local_329)
          ;
          doIfVerbose(this,&local_328);
          std::
          function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_328);
          this_local._7_1_ = 0;
          break;
        }
        og = (QPDFObjGen)
             std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0);
        pQVar4 = std::_List_iterator<QPDFObjectHandle>::operator*
                           ((_List_iterator<QPDFObjectHandle> *)&og);
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_128,pQVar4);
        std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_front
                  ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0);
        local_138 = (undefined1  [8])QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_128);
        bVar1 = QPDFObjGen::set::add((set *)local_80,(QPDFObjGen)local_138);
        if (bVar1) {
          bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_128);
          if (bVar1) {
            QPDFObjectHandle::getDict
                      ((QPDFObjectHandle *)
                       &kids.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          else {
            QPDFObjectHandle::QPDFObjectHandle
                      ((QPDFObjectHandle *)
                       &kids.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (QPDFObjectHandle *)local_128);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_188,"/Kids",&local_189);
          QPDFObjectHandle::getKey
                    ((QPDFObjectHandle *)local_168,
                     (string *)
                     &kids.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string(local_188);
          std::allocator<char>::~allocator(&local_189);
          bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_168);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"/Resources",&local_1b1);
            bVar1 = QPDFObjectHandle::hasKey
                              ((QPDFObjectHandle *)
                               &kids.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::allocator<char>::~allocator(&local_1b1);
            if (!bVar1) {
              iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_168);
              for (local_1e8 = 0; local_1e8 < iVar2; local_1e8 = local_1e8 + 1) {
                QPDFObjectHandle::getArrayItem
                          ((QPDFObjectHandle *)
                           &resources.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (int)local_168);
                std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                          ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0,
                           (value_type *)
                           &resources.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
                QPDFObjectHandle::~QPDFObjectHandle
                          ((QPDFObjectHandle *)
                           &resources.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              }
              goto LAB_002016b3;
            }
            QTC::TC("qpdf","QPDFJob found resources in non-leaf",0);
            _i = (QPDFObjGen *)local_138;
            std::function<void(Pipeline&,std::__cxx11::string_const&)>::
            function<QPDFJob::shouldRemoveUnreferencedResources(QPDF&)::__1,void>
                      ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_1d8,
                       (anon_class_8_1_3fcf6696 *)&i);
            doIfVerbose(this,&local_1d8);
            std::
            function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function(&local_1d8);
            this_local._7_1_ = 1;
            dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_228,"/Resources",&local_229);
            QPDFObjectHandle::getKey
                      ((QPDFObjectHandle *)local_208,
                       (string *)
                       &kids.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__cxx11::string::~string(local_228);
            std::allocator<char>::~allocator(&local_229);
            bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_208);
            if (bVar1) {
              local_234 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_208);
              bVar1 = QPDFObjGen::set::add
                                ((set *)&nodes_seen.
                                         super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                         ._M_t._M_impl.super__Rb_tree_header._M_node_count,local_234
                                );
              if (bVar1) goto LAB_002012f4;
              QTC::TC("qpdf","QPDFJob found shared resources in leaf",0);
              xobject.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138;
              std::function<void(Pipeline&,std::__cxx11::string_const&)>::
              function<QPDFJob::shouldRemoveUnreferencedResources(QPDF&)::__2,void>
                        ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_258,
                         (anon_class_16_2_00a846d8 *)
                         &xobject.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              doIfVerbose(this,&local_258);
              std::
              function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_258);
              this_local._7_1_ = 1;
              dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ = 1;
            }
            else {
LAB_002012f4:
              local_29a = 0;
              local_29b = 0;
              bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_208);
              if (bVar1) {
                std::allocator<char>::allocator();
                local_29a = 1;
                std::__cxx11::string::string<std::allocator<char>>(local_298,"/XObject",&local_299);
                local_29b = 1;
                QPDFObjectHandle::getKey((QPDFObjectHandle *)local_278,(string *)local_208);
              }
              else {
                QPDFObjectHandle::newNull();
              }
              if ((local_29b & 1) != 0) {
                std::__cxx11::string::~string(local_298);
              }
              if ((local_29a & 1) != 0) {
                std::allocator<char>::~allocator(&local_299);
              }
              bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_278);
              if (bVar1) {
                local_2a4 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_278)
                ;
                bVar1 = QPDFObjGen::set::add
                                  ((set *)&nodes_seen.
                                           super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                           ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   local_2a4);
                if (bVar1) goto LAB_00201541;
                QTC::TC("qpdf","QPDFJob found shared xobject in leaf",0);
                __range3 = (Dictionary *)local_138;
                local_2d0 = (QPDFObjectHandle *)local_278;
                std::function<void(Pipeline&,std::__cxx11::string_const&)>::
                function<QPDFJob::shouldRemoveUnreferencedResources(QPDF&)::__3,void>
                          ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_2c8,
                           (anon_class_16_2_6e8780aa *)&__range3);
                doIfVerbose(this,&local_2c8);
                std::
                function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function(&local_2c8);
                this_local._7_1_ = 1;
                dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._4_4_ = 1;
              }
              else {
LAB_00201541:
                QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin3,(typed)local_278);
                __end3 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin3);
                xobj = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                        *)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin3);
                while (bVar1 = std::operator!=(&__end3,(_Self *)&xobj), bVar1) {
                  local_308 = std::
                              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                              ::operator*(&__end3);
                  bVar1 = QPDFObjectHandle::isFormXObject(&local_308->second);
                  if (bVar1) {
                    std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
                    emplace_back<QPDFObjectHandle_const&>
                              ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_d0,
                               &local_308->second);
                  }
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                  ::operator++(&__end3);
                }
                ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin3);
                dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._4_4_ = 0;
              }
              QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_278);
            }
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_208);
            if (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._4_4_ == 0) {
LAB_002016b3:
              dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ = 0;
            }
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_168);
          QPDFObjectHandle::~QPDFObjectHandle
                    ((QPDFObjectHandle *)
                     &kids.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        else {
          dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 2;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_128);
      } while ((dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._4_4_ == 0) ||
              (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ == 2));
      std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~list
                ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d0);
      QPDFObjGen::set::~set((set *)local_80);
      QPDFObjGen::set::~set
                ((set *)&nodes_seen.
                         super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                         _M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFJob::shouldRemoveUnreferencedResources(QPDF& pdf)
{
    if (m->remove_unreferenced_page_resources == QPDFJob::re_no) {
        return false;
    } else if (m->remove_unreferenced_page_resources == QPDFJob::re_yes) {
        return true;
    }

    // Unreferenced resources are common in files where resources dictionaries are shared across
    // pages. As a heuristic, we look in the file for shared resources dictionaries or shared
    // XObject subkeys of resources dictionaries either on pages or on form XObjects in pages. If we
    // find any, then there is a higher likelihood that the expensive process of finding
    // unreferenced resources is worth it.

    // Return true as soon as we find any shared resources.

    QPDFObjGen::set resources_seen; // shared resources detection
    QPDFObjGen::set nodes_seen;     // loop detection

    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": " << pdf.getFilename() << ": checking for shared resources\n";
    });

    std::list<QPDFObjectHandle> queue;
    queue.push_back(pdf.getRoot().getKey("/Pages"));
    while (!queue.empty()) {
        QPDFObjectHandle node = *queue.begin();
        queue.pop_front();
        QPDFObjGen og = node.getObjGen();
        if (!nodes_seen.add(og)) {
            continue;
        }
        QPDFObjectHandle dict = node.isStream() ? node.getDict() : node;
        QPDFObjectHandle kids = dict.getKey("/Kids");
        if (kids.isArray()) {
            // This is a non-leaf node.
            if (dict.hasKey("/Resources")) {
                QTC::TC("qpdf", "QPDFJob found resources in non-leaf");
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << "  found resources in non-leaf page node " << og.unparse(' ') << "\n";
                });
                return true;
            }
            int n = kids.getArrayNItems();
            for (int i = 0; i < n; ++i) {
                queue.push_back(kids.getArrayItem(i));
            }
        } else {
            // This is a leaf node or a form XObject.
            QPDFObjectHandle resources = dict.getKey("/Resources");
            if (resources.isIndirect()) {
                if (!resources_seen.add(resources)) {
                    QTC::TC("qpdf", "QPDFJob found shared resources in leaf");
                    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                        v << "  found shared resources in leaf node " << og.unparse(' ') << ": "
                          << resources.getObjGen().unparse(' ') << "\n";
                    });
                    return true;
                }
            }
            QPDFObjectHandle xobject =
                (resources.isDictionary() ? resources.getKey("/XObject")
                                          : QPDFObjectHandle::newNull());
            if (xobject.isIndirect()) {
                if (!resources_seen.add(xobject)) {
                    QTC::TC("qpdf", "QPDFJob found shared xobject in leaf");
                    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                        v << "  found shared xobject in leaf node " << og.unparse(' ') << ": "
                          << xobject.getObjGen().unparse(' ') << "\n";
                    });
                    return true;
                }
            }

            for (auto const& xobj: xobject.as_dictionary()) {
                if (xobj.second.isFormXObject()) {
                    queue.emplace_back(xobj.second);
                }
            }
        }
    }

    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": no shared resources found\n";
    });
    return false;
}